

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

ggml_tensor * __thiscall
llama_model_loader::require_tensor_meta(llama_model_loader *this,string *name)

{
  llama_tensor_weight *plVar1;
  ggml_tensor *pgVar2;
  runtime_error *this_00;
  string sStack_38;
  
  plVar1 = get_weight(this,(name->_M_dataplus)._M_p);
  if (plVar1 == (llama_tensor_weight *)0x0) {
    pgVar2 = (ggml_tensor *)0x0;
  }
  else {
    pgVar2 = plVar1->tensor;
  }
  if (pgVar2 != (ggml_tensor *)0x0) {
    return pgVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&sStack_38,"%s: tensor \'%s\' not found","require_tensor_meta",
                    (name->_M_dataplus)._M_p);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

struct ggml_tensor * llama_model_loader::require_tensor_meta(const std::string & name) const {
    struct ggml_tensor * tensor = get_tensor_meta(name.c_str());
    if (!tensor) {
        throw std::runtime_error(format("%s: tensor '%s' not found", __func__, name.c_str()));
    }
    return tensor;
}